

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O0

bool rcg::System::setSystemsPath(char *path,char *ignore)

{
  size_type sVar1;
  char *in_RSI;
  char *in_RDI;
  lock_guard<std::recursive_mutex> lock;
  mutex_type *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  bool local_1;
  
  std::lock_guard<std::recursive_mutex>::lock_guard
            ((lock_guard<std::recursive_mutex> *)
             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8
            );
  sVar1 = std::vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>
          ::size((vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>
                  *)(anonymous_namespace)::system_list);
  if (sVar1 == 0) {
    std::__cxx11::string::operator=((string *)(anonymous_namespace)::system_path_abi_cxx11_,"");
    std::__cxx11::string::operator=((string *)(anonymous_namespace)::system_ignore_abi_cxx11_,"");
    if ((in_RDI == (char *)0x0) || (*in_RDI == '\0')) {
      std::__cxx11::string::operator=
                ((string *)(anonymous_namespace)::system_path_abi_cxx11_,
                 "/usr/local/lib/rc_genicam_api");
    }
    else {
      std::__cxx11::string::operator=
                ((string *)(anonymous_namespace)::system_path_abi_cxx11_,in_RDI);
    }
    if (in_RSI != (char *)0x0) {
      std::__cxx11::string::operator=
                ((string *)(anonymous_namespace)::system_ignore_abi_cxx11_,in_RSI);
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x10c58d);
  return local_1;
}

Assistant:

bool System::setSystemsPath(const char *path, const char *ignore)
{
  std::lock_guard<std::recursive_mutex> lock(system_mtx);

  if (system_list.size() == 0)
  {
    system_path="";
    system_ignore="";

    if (path == 0 || path[0] == '\0')
    {
#ifdef _WIN32
      // under Windows, use the path to the current executable as fallback

      const size_t n=256;
      char procpath[n];
      std::string path_to_exe;
      if (GetModuleFileNameA(NULL, procpath, n-1) > 0)
      {
        procpath[n-1]='\0';

        char *p=strrchr(procpath, '\\');
        if (p != 0) *p='\0';

        path_to_exe=procpath;

        if (system_path.size() > 0) system_path+=";";

        system_path += path_to_exe;
      }

      // another fallback is the path to the current library

      const auto path_to_this_dll = getPathToThisDll();
      if (!path_to_this_dll.empty() && path_to_this_dll != path_to_exe)
      {
        if (system_path.size() > 0) system_path+=";";

        system_path += path_to_this_dll;
      }

	  // and possible sub-directories of the library

      HANDLE file_handle;
      WIN32_FIND_DATAA file_info;

      file_handle=FindFirstFileA((path_to_this_dll+"\\*").c_str(), &file_info);

      if (file_handle != INVALID_HANDLE_VALUE)
      {
        do
        {
          if ((file_info.dwFileAttributes & FILE_ATTRIBUTE_DIRECTORY) != 0 && file_info.cFileName[0] != '.' )
          {
            system_path += ";" + path_to_this_dll + "\\" + file_info.cFileName;
          }
        }
        while (FindNextFileA(file_handle, &file_info));

        FindClose(file_handle);
      }
#else
      // otherwise, use the absolute install path to the default transport layer

      system_path=GENTL_INSTALL_PATH;
#endif
    }
    else
    {
      system_path=path;
    }

    if (ignore != 0)
    {
      system_ignore=ignore;
    }

    return true;
  }

  return false;
}